

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O3

void __thiscall
glu::Texture1D::Texture1D(Texture1D *this,RenderContext *context,deUint32 sizedFormat,int width)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  TextureFormat local_28;
  
  this->m_context = context;
  this->m_format = sizedFormat;
  local_28 = mapGLInternalFormat(sizedFormat);
  tcu::Texture1D::Texture1D(&this->m_refTexture,&local_28,width);
  this->m_glTexture = 0;
  iVar1 = (*context->_vptr_RenderContext[3])(context);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6f8))(1,&this->m_glTexture);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  checkError(err,"glGenTextures() failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x47);
  return;
}

Assistant:

Texture1D::Texture1D (const RenderContext& context, deUint32 sizedFormat, int width)
	: m_context			(context)
	, m_format			(sizedFormat)
	, m_refTexture		(mapGLInternalFormat(sizedFormat), width)
	, m_glTexture		(0)
{
	const glw::Functions& gl = context.getFunctions();
	gl.genTextures(1, &m_glTexture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed");
}